

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

char * sqlite3NameFromToken(sqlite3 *db,Token *pName)

{
  char *local_20;
  char *zName;
  Token *pName_local;
  sqlite3 *db_local;
  
  if (pName == (Token *)0x0) {
    local_20 = (char *)0x0;
  }
  else {
    local_20 = sqlite3DbStrNDup(db,pName->z,(ulong)pName->n);
    sqlite3Dequote(local_20);
  }
  return local_20;
}

Assistant:

SQLITE_PRIVATE char *sqlite3NameFromToken(sqlite3 *db, Token *pName){
  char *zName;
  if( pName ){
    zName = sqlite3DbStrNDup(db, (char*)pName->z, pName->n);
    sqlite3Dequote(zName);
  }else{
    zName = 0;
  }
  return zName;
}